

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::WeakZeroSourceSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SERecurrentNode *destination,
          SENode *coefficient,DistanceEntry *distance_entry)

{
  bool bVar1;
  int iVar2;
  SENode *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SENode *pSVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int64_t iVar5;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  SEConstantNode *value;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  allocator<char> local_519;
  string local_518;
  SERecurrentNode *local_4f8;
  SENode *final_trip_SENode;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  allocator<char> local_439;
  string local_438;
  SERecurrentNode *local_418;
  SENode *first_trip_SENode;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  int64_t local_2a0;
  int64_t upper_bound_value;
  int64_t lower_bound_value;
  string local_288;
  SEConstantNode *local_268;
  SEConstantNode *upper_bound;
  SEConstantNode *lower_bound;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  string local_108;
  int64_t local_e8;
  int64_t coefficient_value;
  int64_t delta_value;
  string local_d0;
  SEConstantNode *local_b0;
  SEConstantNode *coefficient_constant;
  SEConstantNode *delta_constant;
  int64_t distance;
  SENode *delta;
  SENode *destination_constant_term;
  Loop *subscript_loop;
  undefined1 local_70 [8];
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  string local_58;
  DistanceEntry *local_38;
  DistanceEntry *distance_entry_local;
  SENode *coefficient_local;
  SERecurrentNode *destination_local;
  SENode *source_local;
  LoopDependenceAnalysis *this_local;
  
  local_38 = distance_entry;
  distance_entry_local = (DistanceEntry *)coefficient;
  coefficient_local = &destination->super_SENode;
  destination_local = (SERecurrentNode *)source;
  source_local = (SENode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Performing WeakZeroSourceSIVTest.",
             (allocator<char> *)((long)&subscript_pair.second + 7));
  PrintDebug(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&subscript_pair.second + 7));
  _subscript_loop =
       std::make_pair<spvtools::opt::SENode*&,spvtools::opt::SERecurrentNode*&>
                 ((SENode **)&destination_local,(SERecurrentNode **)&coefficient_local);
  std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>::
  pair<spvtools::opt::SENode_*,_spvtools::opt::SERecurrentNode_*,_true>
            ((pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_70,
             (pair<spvtools::opt::SENode_*,_spvtools::opt::SERecurrentNode_*> *)&subscript_loop);
  destination_constant_term =
       (SENode *)
       GetLoopForSubscriptPair
                 (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_70);
  delta = GetConstantTerm(this,(Loop *)destination_constant_term,
                          (SERecurrentNode *)coefficient_local);
  pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction
                     (&this->scalar_evolution_,&destination_local->super_SENode,delta);
  distance = (int64_t)ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
  delta_constant = (SEConstantNode *)0x0;
  iVar2 = (*((SENode *)distance)->_vptr_SENode[4])();
  coefficient_constant = (SEConstantNode *)CONCAT44(extraout_var,iVar2);
  local_b0 = (SEConstantNode *)(**(code **)(*(long *)distance_entry_local + 0x20))();
  if ((coefficient_constant == (SEConstantNode *)0x0) || (local_b0 == (SEConstantNode *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,
               "WeakZeroSourceSIVTest was unable to fold delta and coefficient to constants.",
               (allocator<char> *)((long)&lower_bound + 7));
    PrintDebug(this,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lower_bound + 7));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "WeakZeroSourceSIVTest folding delta and coefficient to constants.",
               (allocator<char> *)((long)&delta_value + 7));
    PrintDebug(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&delta_value + 7));
    coefficient_value = SEConstantNode::FoldToSingleValue(coefficient_constant);
    local_e8 = SEConstantNode::FoldToSingleValue(local_b0);
    if (coefficient_value % local_e8 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,
                 "WeakZeroSourceSIVTest proved independence through distance not being an integer.",
                 &local_109);
      PrintDebug(this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      local_38->dependence_information = DIRECTION;
      local_38->direction = NONE;
      return true;
    }
    delta_constant = (SEConstantNode *)(coefficient_value / local_e8);
    ToString<long>(&local_1f0,this,coefficient_value);
    std::operator+(&local_1d0,
                   "WeakZeroSourceSIVTest calculated distance with the following values\n\tdelta value: "
                   ,&local_1f0);
    std::operator+(&local_1b0,&local_1d0,"\n\tcoefficient value: ");
    ToString<long>(&local_210,this,local_e8);
    std::operator+(&local_190,&local_1b0,&local_210);
    std::operator+(&local_170,&local_190,"\n\tdistance: ");
    ToString<long>(&local_230,this,(long)delta_constant);
    std::operator+(&local_150,&local_170,&local_230);
    std::operator+(&local_130,&local_150,"\n");
    PrintDebug(this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  pSVar3 = GetLowerBound(this,(Loop *)destination_constant_term);
  iVar2 = (*pSVar3->_vptr_SENode[4])();
  upper_bound = (SEConstantNode *)CONCAT44(extraout_var_00,iVar2);
  pSVar3 = GetUpperBound(this,(Loop *)destination_constant_term);
  iVar2 = (*pSVar3->_vptr_SENode[4])();
  local_268 = (SEConstantNode *)CONCAT44(extraout_var_01,iVar2);
  if ((upper_bound == (SEConstantNode *)0x0) || (local_268 == (SEConstantNode *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,
               "WeakZeroSourceSIVTest was unable to find lower and upper bound as SEConstantNodes.",
               (allocator<char> *)((long)&first_trip_SENode + 7));
    PrintDebug(this,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)((long)&first_trip_SENode + 7));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"WeakZeroSourceSIVTest found bounds as SEConstantNodes.",
               (allocator<char> *)((long)&lower_bound_value + 7));
    PrintDebug(this,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lower_bound_value + 7));
    upper_bound_value = SEConstantNode::FoldToSingleValue(upper_bound);
    local_2a0 = SEConstantNode::FoldToSingleValue(local_268);
    value = delta_constant;
    if ((long)delta_constant < 1) {
      value = (SEConstantNode *)-(long)delta_constant;
    }
    bVar1 = IsWithinBounds(this,(int64_t)value,upper_bound_value,local_2a0);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,
                 "WeakZeroSourceSIVTest proved independence through distance escaping the loop bounds."
                 ,&local_2c1);
      PrintDebug(this,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      ToString<long>(&local_3a8,this,upper_bound_value);
      std::operator+(&local_388,"Bound values were as follow\n\tlower bound value: ",&local_3a8);
      std::operator+(&local_368,&local_388,"\n\tupper bound value: ");
      ToString<long>(&local_3c8,this,local_2a0);
      std::operator+(&local_348,&local_368,&local_3c8);
      std::operator+(&local_328,&local_348,"\n\tdistance value: ");
      ToString<long>(&local_3e8,this,(long)delta_constant);
      std::operator+(&local_308,&local_328,&local_3e8);
      std::operator+(&local_2e8,&local_308,"\n");
      PrintDebug(this,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      local_38->dependence_information = DISTANCE;
      local_38->direction = NONE;
      local_38->distance = (int64_t)delta_constant;
      return true;
    }
  }
  pSVar3 = GetFirstTripInductionNode(this,(Loop *)destination_constant_term);
  pSVar4 = GetConstantTerm(this,(Loop *)destination_constant_term,
                           (SERecurrentNode *)coefficient_local);
  pSVar3 = ScalarEvolutionAnalysis::CreateAddNode(&this->scalar_evolution_,pSVar3,pSVar4);
  local_418 = (SERecurrentNode *)
              ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
  if (local_418 == (SERecurrentNode *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,"WeakZeroSourceSIVTest was unable to build first_trip_SENode",
               (allocator<char> *)((long)&final_trip_SENode + 7));
    PrintDebug(this,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&final_trip_SENode + 7));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"WeakZeroSourceSIVTest built first_trip_SENode.",&local_439);
    PrintDebug(this,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    iVar2 = (*(local_418->super_SENode)._vptr_SENode[4])();
    if (CONCAT44(extraout_var_02,iVar2) != 0) {
      iVar2 = (*(local_418->super_SENode)._vptr_SENode[4])();
      iVar5 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var_03,iVar2));
      ToString<long>(&local_4a0,this,iVar5);
      std::operator+(&local_480,
                     "WeakZeroSourceSIVTest has found first_trip_SENode as an SEConstantNode with value: "
                     ,&local_4a0);
      std::operator+(&local_460,&local_480,"\n");
      PrintDebug(this,&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
    }
    if (destination_local == local_418) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,
                 "WeakZeroSourceSIVTest has found peeling first iteration will break dependency",
                 &local_4c1);
      PrintDebug(this,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      local_38->dependence_information = PEEL;
      local_38->peel_first = true;
      return false;
    }
  }
  pSVar3 = GetFinalTripInductionNode
                     (this,(Loop *)destination_constant_term,(SENode *)distance_entry_local);
  pSVar4 = GetConstantTerm(this,(Loop *)destination_constant_term,
                           (SERecurrentNode *)coefficient_local);
  pSVar3 = ScalarEvolutionAnalysis::CreateAddNode(&this->scalar_evolution_,pSVar3,pSVar4);
  local_4f8 = (SERecurrentNode *)
              ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
  if (local_4f8 == (SERecurrentNode *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"WeakZeroSourceSIVTest was unable to build final_trip_SENode",
               &local_5c9);
    PrintDebug(this,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"WeakZeroSourceSIVTest built final_trip_SENode.",&local_519);
    PrintDebug(this,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    iVar2 = (*(local_418->super_SENode)._vptr_SENode[4])();
    if (CONCAT44(extraout_var_04,iVar2) != 0) {
      iVar2 = (*(local_4f8->super_SENode)._vptr_SENode[4])();
      iVar5 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var_05,iVar2));
      ToString<long>(&local_580,this,iVar5);
      std::operator+(&local_560,
                     "WeakZeroSourceSIVTest has found final_trip_SENode as an SEConstantNode with value: "
                     ,&local_580);
      std::operator+(&local_540,&local_560,"\n");
      PrintDebug(this,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_580);
    }
    if (destination_local == local_4f8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a0,
                 "WeakZeroSourceSIVTest has found peeling final iteration will break dependency",
                 &local_5a1);
      PrintDebug(this,&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::allocator<char>::~allocator(&local_5a1);
      local_38->dependence_information = PEEL;
      local_38->peel_last = true;
      return false;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,
             "WeakZeroSourceSIVTest was unable to determine any dependence information.",&local_5f1)
  ;
  PrintDebug(this,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  local_38->direction = ALL;
  return false;
}

Assistant:

bool LoopDependenceAnalysis::WeakZeroSourceSIVTest(
    SENode* source, SERecurrentNode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing WeakZeroSourceSIVTest.");
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  // Build an SENode for distance.
  SENode* destination_constant_term =
      GetConstantTerm(subscript_loop, destination);
  SENode* delta = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateSubtraction(source, destination_constant_term));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  int64_t distance = 0;
  SEConstantNode* delta_constant = delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    PrintDebug(
        "WeakZeroSourceSIVTest folding delta and coefficient to constants.");
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    // Check if the distance is not integral.
    if (delta_value % coefficient_value != 0) {
      PrintDebug(
          "WeakZeroSourceSIVTest proved independence through distance not "
          "being an integer.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / coefficient_value;
      PrintDebug(
          "WeakZeroSourceSIVTest calculated distance with the following "
          "values\n"
          "\tdelta value: " +
          ToString(delta_value) +
          "\n\tcoefficient value: " + ToString(coefficient_value) +
          "\n\tdistance: " + ToString(distance) + "\n");
    }
  } else {
    PrintDebug(
        "WeakZeroSourceSIVTest was unable to fold delta and coefficient to "
        "constants.");
  }

  // If we can prove the distance is outside the bounds we prove independence.
  SEConstantNode* lower_bound =
      GetLowerBound(subscript_loop)->AsSEConstantNode();
  SEConstantNode* upper_bound =
      GetUpperBound(subscript_loop)->AsSEConstantNode();
  if (lower_bound && upper_bound) {
    PrintDebug("WeakZeroSourceSIVTest found bounds as SEConstantNodes.");
    int64_t lower_bound_value = lower_bound->FoldToSingleValue();
    int64_t upper_bound_value = upper_bound->FoldToSingleValue();
    if (!IsWithinBounds(llabs(distance), lower_bound_value,
                        upper_bound_value)) {
      PrintDebug(
          "WeakZeroSourceSIVTest proved independence through distance escaping "
          "the loop bounds.");
      PrintDebug(
          "Bound values were as follow\n"
          "\tlower bound value: " +
          ToString(lower_bound_value) +
          "\n\tupper bound value: " + ToString(upper_bound_value) +
          "\n\tdistance value: " + ToString(distance) + "\n");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DISTANCE;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      distance_entry->distance = distance;
      return true;
    }
  } else {
    PrintDebug(
        "WeakZeroSourceSIVTest was unable to find lower and upper bound as "
        "SEConstantNodes.");
  }

  // Now we want to see if we can detect to peel the first or last iterations.

  // We get the FirstTripValue as GetFirstTripInductionNode() +
  // GetConstantTerm(destination)
  SENode* first_trip_SENode =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
          GetFirstTripInductionNode(subscript_loop),
          GetConstantTerm(subscript_loop, destination)));

  // If source == FirstTripValue, peel_first.
  if (first_trip_SENode) {
    PrintDebug("WeakZeroSourceSIVTest built first_trip_SENode.");
    if (first_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroSourceSIVTest has found first_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(first_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (source == first_trip_SENode) {
      // We have found that peeling the first iteration will break dependency.
      PrintDebug(
          "WeakZeroSourceSIVTest has found peeling first iteration will break "
          "dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_first = true;
      return false;
    }
  } else {
    PrintDebug("WeakZeroSourceSIVTest was unable to build first_trip_SENode");
  }

  // We get the LastTripValue as GetFinalTripInductionNode(coefficient) +
  // GetConstantTerm(destination)
  SENode* final_trip_SENode =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
          GetFinalTripInductionNode(subscript_loop, coefficient),
          GetConstantTerm(subscript_loop, destination)));

  // If source == LastTripValue, peel_last.
  if (final_trip_SENode) {
    PrintDebug("WeakZeroSourceSIVTest built final_trip_SENode.");
    if (first_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroSourceSIVTest has found final_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(final_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (source == final_trip_SENode) {
      // We have found that peeling the last iteration will break dependency.
      PrintDebug(
          "WeakZeroSourceSIVTest has found peeling final iteration will break "
          "dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_last = true;
      return false;
    }
  } else {
    PrintDebug("WeakZeroSourceSIVTest was unable to build final_trip_SENode");
  }

  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "WeakZeroSourceSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}